

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O2

bool __thiscall
cmCTestCoverageHandler::ParseBullsEyeCovsrcLine
          (cmCTestCoverageHandler *this,string *inputLine,string *sourceFile,int *functionsCalled,
          int *totalFunctions,int *percentFunction,int *branchCovered,int *totalBranches,
          int *percentBranch)

{
  cmCTest *pcVar1;
  long lVar2;
  ostream *poVar3;
  cmCTestCoverageHandler *this_00;
  char *local_1d0 [4];
  size_type local_1b0;
  ostringstream cmCTestLog_msg;
  
  lVar2 = std::__cxx11::string::find((char)inputLine,0x2c);
  if (lVar2 == -1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"Error parsing string : ");
    poVar3 = std::operator<<(poVar3,(string *)inputLine);
    std::operator<<(poVar3,"\n");
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x881,local_1d0[0],false);
  }
  else {
    this_00 = (cmCTestCoverageHandler *)&cmCTestLog_msg;
    std::__cxx11::string::substr((ulong)this_00,(ulong)inputLine);
    std::__cxx11::string::operator=((string *)sourceFile,(string *)this_00);
    std::__cxx11::string::~string((string *)this_00);
    local_1b0 = lVar2 + 1;
    GetNextInt(this_00,inputLine,&local_1b0,functionsCalled);
    GetNextInt(this_00,inputLine,&local_1b0,totalFunctions);
    GetNextInt(this_00,inputLine,&local_1b0,percentFunction);
    GetNextInt(this_00,inputLine,&local_1b0,branchCovered);
    GetNextInt(this_00,inputLine,&local_1b0,totalBranches);
    GetNextInt(this_00,inputLine,&local_1b0,percentBranch);
    if (local_1b0 == 0xffffffffffffffff) goto LAB_0016a8fc;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"Error parsing input : ");
    poVar3 = std::operator<<(poVar3,(string *)inputLine);
    poVar3 = std::operator<<(poVar3," last pos not npos =  ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,"\n");
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x89d,local_1d0[0],false);
  }
  std::__cxx11::string::~string((string *)local_1d0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
LAB_0016a8fc:
  return lVar2 != -1;
}

Assistant:

bool cmCTestCoverageHandler::ParseBullsEyeCovsrcLine(
  std::string const& inputLine, std::string& sourceFile, int& functionsCalled,
  int& totalFunctions, int& percentFunction, int& branchCovered,
  int& totalBranches, int& percentBranch)
{
  // find the first comma
  std::string::size_type pos = inputLine.find(',');
  if (pos == std::string::npos) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error parsing string : " << inputLine << "\n");
    return false;
  }
  // the source file has "" around it so extract out the file name
  sourceFile = inputLine.substr(1, pos - 2);
  pos++;
  if (!this->GetNextInt(inputLine, pos, functionsCalled)) {
    return false;
  }
  if (!this->GetNextInt(inputLine, pos, totalFunctions)) {
    return false;
  }
  if (!this->GetNextInt(inputLine, pos, percentFunction)) {
    return false;
  }
  if (!this->GetNextInt(inputLine, pos, branchCovered)) {
    return false;
  }
  if (!this->GetNextInt(inputLine, pos, totalBranches)) {
    return false;
  }
  if (!this->GetNextInt(inputLine, pos, percentBranch)) {
    return false;
  }
  // should be at the end now
  if (pos != std::string::npos) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error parsing input : "
                 << inputLine << " last pos not npos =  " << pos << "\n");
  }
  return true;
}